

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O0

void quantize_lp(int16_t *iscan_ptr,int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *qcoeff_ptr,
                int16_t *dqcoeff_ptr,__m128i *round0,__m128i *round1,__m128i *quant0,__m128i *quant1
                ,__m128i *dequant0,__m128i *dequant1,__m128i *eob)

{
  undefined1 (*pauVar1) [16];
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 *puVar14;
  long lVar15;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  undefined1 (*in_R9) [16];
  ushort uVar16;
  ulong uVar17;
  ulong uVar18;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar27;
  ushort uVar28;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong uVar25;
  ulong uVar26;
  ushort uVar29;
  __m128i nzero_coeff0;
  __m128i zero_coeff1;
  __m128i zero_coeff0;
  __m128i zero;
  int16_t *addr;
  __m128i qtmp1;
  __m128i qtmp0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1_sign;
  __m128i coeff0_sign;
  __m128i coeff1;
  __m128i coeff0;
  int16_t *read;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ulong local_458;
  ulong uStack_450;
  ulong local_448;
  ulong uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  __m128i eob2;
  __m128i eob1;
  __m128i eob0;
  __m128i iscan1_nz;
  __m128i iscan0_nz;
  __m128i iscan1;
  __m128i iscan0;
  __m128i nzero_coeff1;
  
  pauVar1 = (undefined1 (*) [16])(in_RSI + in_RDX * 2);
  auVar19 = psraw(*pauVar1,ZEXT416(0xf));
  auVar20 = psraw(pauVar1[1],ZEXT416(0xf));
  local_448 = auVar19._0_8_;
  uStack_440 = auVar19._8_8_;
  uVar17 = *(ulong *)*pauVar1 ^ local_448;
  uVar25 = *(ulong *)(*pauVar1 + 8) ^ uStack_440;
  local_458 = auVar20._0_8_;
  uStack_450 = auVar20._8_8_;
  uVar18 = *(ulong *)pauVar1[1] ^ local_458;
  uVar26 = *(ulong *)(pauVar1[1] + 8) ^ uStack_450;
  local_208 = (short)uVar17;
  sStack_206 = (short)(uVar17 >> 0x10);
  sStack_204 = (short)(uVar17 >> 0x20);
  sStack_202 = (short)(uVar17 >> 0x30);
  sStack_200 = (short)uVar25;
  sStack_1fe = (short)(uVar25 >> 0x10);
  sStack_1fc = (short)(uVar25 >> 0x20);
  sStack_1fa = (short)(uVar25 >> 0x30);
  local_218 = auVar19._0_2_;
  sStack_216 = auVar19._2_2_;
  sStack_214 = auVar19._4_2_;
  sStack_212 = auVar19._6_2_;
  sStack_210 = auVar19._8_2_;
  sStack_20e = auVar19._10_2_;
  sStack_20c = auVar19._12_2_;
  sStack_20a = auVar19._14_2_;
  local_468._0_4_ = CONCAT22(sStack_206 - sStack_216,local_208 - local_218);
  local_468._0_6_ = CONCAT24(sStack_204 - sStack_214,(undefined4)local_468);
  local_468 = CONCAT26(sStack_202 - sStack_212,(undefined6)local_468);
  uStack_460._0_2_ = sStack_200 - sStack_210;
  uStack_460._2_2_ = sStack_1fe - sStack_20e;
  uStack_460._4_2_ = sStack_1fc - sStack_20c;
  uStack_460._6_2_ = sStack_1fa - sStack_20a;
  local_228 = (short)uVar18;
  sStack_226 = (short)(uVar18 >> 0x10);
  sStack_224 = (short)(uVar18 >> 0x20);
  sStack_222 = (short)(uVar18 >> 0x30);
  sStack_220 = (short)uVar26;
  sStack_21e = (short)(uVar26 >> 0x10);
  sStack_21c = (short)(uVar26 >> 0x20);
  sStack_21a = (short)(uVar26 >> 0x30);
  local_238 = auVar20._0_2_;
  sStack_236 = auVar20._2_2_;
  sStack_234 = auVar20._4_2_;
  sStack_232 = auVar20._6_2_;
  sStack_230 = auVar20._8_2_;
  sStack_22e = auVar20._10_2_;
  sStack_22c = auVar20._12_2_;
  sStack_22a = auVar20._14_2_;
  local_478._0_4_ = CONCAT22(sStack_226 - sStack_236,local_228 - local_238);
  local_478._0_6_ = CONCAT24(sStack_224 - sStack_234,(undefined4)local_478);
  local_478 = CONCAT26(sStack_222 - sStack_232,(undefined6)local_478);
  uStack_470._0_2_ = sStack_220 - sStack_230;
  uStack_470._2_2_ = sStack_21e - sStack_22e;
  uStack_470._4_2_ = sStack_21c - sStack_22c;
  uStack_470._6_2_ = sStack_21a - sStack_22a;
  auVar20._8_8_ = uStack_460;
  auVar20._0_8_ = local_468;
  auVar20 = paddsw(auVar20,*in_R9);
  auVar19._8_8_ = uStack_470;
  auVar19._0_8_ = local_478;
  auVar19 = paddsw(auVar19,*(undefined1 (*) [16])nzero_coeff0[1]);
  auVar20 = pmulhw(auVar20,*(undefined1 (*) [16])zero_coeff1[0]);
  auVar19 = pmulhw(auVar19,*(undefined1 (*) [16])zero_coeff1[1]);
  local_488 = auVar20._0_8_;
  uStack_480 = auVar20._8_8_;
  local_488 = local_488 ^ local_448;
  uStack_480 = uStack_480 ^ uStack_440;
  local_498 = auVar19._0_8_;
  uStack_490 = auVar19._8_8_;
  local_498 = local_498 ^ local_458;
  uStack_490 = uStack_490 ^ uStack_450;
  local_248 = (short)local_488;
  sStack_246 = (short)(local_488 >> 0x10);
  sStack_244 = (short)(local_488 >> 0x20);
  sStack_242 = (short)(local_488 >> 0x30);
  sStack_240 = (short)uStack_480;
  sStack_23e = (short)(uStack_480 >> 0x10);
  sStack_23c = (short)(uStack_480 >> 0x20);
  sStack_23a = (short)(uStack_480 >> 0x30);
  local_468._0_4_ = CONCAT22(sStack_246 - sStack_216,local_248 - local_218);
  local_468._0_6_ = CONCAT24(sStack_244 - sStack_214,(undefined4)local_468);
  local_468 = CONCAT26(sStack_242 - sStack_212,(undefined6)local_468);
  uStack_460._0_2_ = sStack_240 - sStack_210;
  uStack_460._2_2_ = sStack_23e - sStack_20e;
  uStack_460._4_2_ = sStack_23c - sStack_20c;
  uStack_460._6_2_ = sStack_23a - sStack_20a;
  local_268 = (short)local_498;
  sStack_266 = (short)(local_498 >> 0x10);
  sStack_264 = (short)(local_498 >> 0x20);
  sStack_262 = (short)(local_498 >> 0x30);
  sStack_260 = (short)uStack_490;
  sStack_25e = (short)(uStack_490 >> 0x10);
  sStack_25c = (short)(uStack_490 >> 0x20);
  sStack_25a = (short)(uStack_490 >> 0x30);
  local_478._0_4_ = CONCAT22(sStack_266 - sStack_236,local_268 - local_238);
  local_478._0_6_ = CONCAT24(sStack_264 - sStack_234,(undefined4)local_478);
  local_478 = CONCAT26(sStack_262 - sStack_232,(undefined6)local_478);
  uStack_470._0_2_ = sStack_260 - sStack_230;
  uStack_470._2_2_ = sStack_25e - sStack_22e;
  uStack_470._4_2_ = sStack_25c - sStack_22c;
  uStack_470._6_2_ = sStack_25a - sStack_22a;
  puVar14 = (undefined8 *)(in_RCX + in_RDX * 2);
  *puVar14 = local_468;
  puVar14[1] = uStack_460;
  puVar14[2] = local_478;
  puVar14[3] = uStack_470;
  uVar10 = *(undefined8 *)zero_coeff0[0];
  uVar11 = *(undefined8 *)(zero_coeff0[0] + 8);
  local_d8 = (short)uVar10;
  sStack_d6 = (short)((ulong)uVar10 >> 0x10);
  sStack_d4 = (short)((ulong)uVar10 >> 0x20);
  sStack_d2 = (short)((ulong)uVar10 >> 0x30);
  sStack_d0 = (short)uVar11;
  sStack_ce = (short)((ulong)uVar11 >> 0x10);
  sStack_cc = (short)((ulong)uVar11 >> 0x20);
  sStack_ca = (short)((ulong)uVar11 >> 0x30);
  local_d8 = (local_248 - local_218) * local_d8;
  sStack_d6 = (sStack_246 - sStack_216) * sStack_d6;
  sStack_d4 = (sStack_244 - sStack_214) * sStack_d4;
  sStack_d2 = (sStack_242 - sStack_212) * sStack_d2;
  sStack_d0 = (sStack_240 - sStack_210) * sStack_d0;
  sStack_ce = (sStack_23e - sStack_20e) * sStack_ce;
  sStack_cc = (sStack_23c - sStack_20c) * sStack_cc;
  sStack_ca = (sStack_23a - sStack_20a) * sStack_ca;
  local_428 = CONCAT26(sStack_d2,CONCAT24(sStack_d4,CONCAT22(sStack_d6,local_d8)));
  uStack_420 = CONCAT26(sStack_ca,CONCAT24(sStack_cc,CONCAT22(sStack_ce,sStack_d0)));
  uVar10 = *(undefined8 *)zero_coeff0[1];
  uVar11 = *(undefined8 *)(zero_coeff0[1] + 8);
  local_f8 = (short)uVar10;
  sStack_f6 = (short)((ulong)uVar10 >> 0x10);
  sStack_f4 = (short)((ulong)uVar10 >> 0x20);
  sStack_f2 = (short)((ulong)uVar10 >> 0x30);
  sStack_f0 = (short)uVar11;
  sStack_ee = (short)((ulong)uVar11 >> 0x10);
  sStack_ec = (short)((ulong)uVar11 >> 0x20);
  sStack_ea = (short)((ulong)uVar11 >> 0x30);
  local_f8 = (local_268 - local_238) * local_f8;
  sStack_f6 = (sStack_266 - sStack_236) * sStack_f6;
  sStack_f4 = (sStack_264 - sStack_234) * sStack_f4;
  sStack_f2 = (sStack_262 - sStack_232) * sStack_f2;
  sStack_f0 = (sStack_260 - sStack_230) * sStack_f0;
  sStack_ee = (sStack_25e - sStack_22e) * sStack_ee;
  sStack_ec = (sStack_25c - sStack_22c) * sStack_ec;
  sStack_ea = (sStack_25a - sStack_22a) * sStack_ea;
  local_438 = CONCAT26(sStack_f2,CONCAT24(sStack_f4,CONCAT22(sStack_f6,local_f8)));
  uStack_430 = CONCAT26(sStack_ea,CONCAT24(sStack_ec,CONCAT22(sStack_ee,sStack_f0)));
  puVar14 = (undefined8 *)(in_R8 + in_RDX * 2);
  *puVar14 = local_428;
  puVar14[1] = uStack_420;
  puVar14[2] = local_438;
  puVar14[3] = uStack_430;
  uVar16 = (ushort)(local_d8 != 0);
  uVar22 = (ushort)(sStack_d6 != 0);
  uVar24 = (ushort)(sStack_d4 != 0);
  uVar28 = (ushort)(sStack_d2 != 0);
  uVar2 = (ushort)(sStack_d0 != 0);
  uVar4 = (ushort)(sStack_ce != 0);
  uVar6 = (ushort)(sStack_cc != 0);
  uVar8 = (ushort)(sStack_ca != 0);
  uVar21 = (ushort)(local_f8 != 0);
  uVar23 = (ushort)(sStack_f6 != 0);
  uVar27 = (ushort)(sStack_f4 != 0);
  uVar29 = (ushort)(sStack_f2 != 0);
  uVar3 = (ushort)(sStack_f0 != 0);
  uVar5 = (ushort)(sStack_ee != 0);
  uVar7 = (ushort)(sStack_ec != 0);
  uVar9 = (ushort)(sStack_ea != 0);
  puVar14 = (undefined8 *)(in_RDI + in_RDX * 2);
  uVar10 = *puVar14;
  uVar11 = puVar14[1];
  lVar15 = in_RDI + in_RDX * 2;
  uVar12 = *(undefined8 *)(lVar15 + 0x10);
  uVar13 = *(undefined8 *)(lVar15 + 0x18);
  local_288 = (short)uVar10;
  sStack_286 = (short)((ulong)uVar10 >> 0x10);
  sStack_284 = (short)((ulong)uVar10 >> 0x20);
  sStack_282 = (short)((ulong)uVar10 >> 0x30);
  sStack_280 = (short)uVar11;
  sStack_27e = (short)((ulong)uVar11 >> 0x10);
  sStack_27c = (short)((ulong)uVar11 >> 0x20);
  sStack_27a = (short)((ulong)uVar11 >> 0x30);
  local_2a8 = (short)uVar12;
  sStack_2a6 = (short)((ulong)uVar12 >> 0x10);
  sStack_2a4 = (short)((ulong)uVar12 >> 0x20);
  sStack_2a2 = (short)((ulong)uVar12 >> 0x30);
  sStack_2a0 = (short)uVar13;
  sStack_29e = (short)((ulong)uVar13 >> 0x10);
  sStack_29c = (short)((ulong)uVar13 >> 0x20);
  sStack_29a = (short)((ulong)uVar13 >> 0x30);
  uVar17 = CONCAT26(sStack_282 + uVar28,
                    CONCAT24(sStack_284 + uVar24,CONCAT22(sStack_286 + uVar22,local_288 + uVar16)))
           & CONCAT26(-uVar28,CONCAT24(-uVar24,CONCAT22(-uVar22,-uVar16)));
  uVar25 = CONCAT26(sStack_27a + uVar8,
                    CONCAT24(sStack_27c + uVar6,CONCAT22(sStack_27e + uVar4,sStack_280 + uVar2))) &
           CONCAT26(-uVar8,CONCAT24(-uVar6,CONCAT22(-uVar4,-uVar2)));
  uVar18 = CONCAT26(sStack_2a2 + uVar29,
                    CONCAT24(sStack_2a4 + uVar27,CONCAT22(sStack_2a6 + uVar23,local_2a8 + uVar21)))
           & CONCAT26(-uVar29,CONCAT24(-uVar27,CONCAT22(-uVar23,-uVar21)));
  uVar26 = CONCAT26(sStack_29a + uVar9,
                    CONCAT24(sStack_29c + uVar7,CONCAT22(sStack_29e + uVar5,sStack_2a0 + uVar3))) &
           CONCAT26(-uVar9,CONCAT24(-uVar7,CONCAT22(-uVar5,-uVar3)));
  local_348 = (short)uVar17;
  sStack_346 = (short)(uVar17 >> 0x10);
  sStack_344 = (short)(uVar17 >> 0x20);
  sStack_342 = (short)(uVar17 >> 0x30);
  sStack_340 = (short)uVar25;
  sStack_33e = (short)(uVar25 >> 0x10);
  sStack_33c = (short)(uVar25 >> 0x20);
  sStack_33a = (short)(uVar25 >> 0x30);
  local_358 = (short)uVar18;
  sStack_356 = (short)(uVar18 >> 0x10);
  sStack_354 = (short)(uVar18 >> 0x20);
  sStack_352 = (short)(uVar18 >> 0x30);
  sStack_350 = (short)uVar26;
  sStack_34e = (short)(uVar26 >> 0x10);
  sStack_34c = (short)(uVar26 >> 0x20);
  sStack_34a = (short)(uVar26 >> 0x30);
  uVar16 = (ushort)(local_348 < local_358) * local_358 |
           (ushort)(local_348 >= local_358) * local_348;
  uVar21 = (ushort)(sStack_346 < sStack_356) * sStack_356 |
           (ushort)(sStack_346 >= sStack_356) * sStack_346;
  uVar22 = (ushort)(sStack_344 < sStack_354) * sStack_354 |
           (ushort)(sStack_344 >= sStack_354) * sStack_344;
  uVar23 = (ushort)(sStack_342 < sStack_352) * sStack_352 |
           (ushort)(sStack_342 >= sStack_352) * sStack_342;
  uVar24 = (ushort)(sStack_340 < sStack_350) * sStack_350 |
           (ushort)(sStack_340 >= sStack_350) * sStack_340;
  uVar27 = (ushort)(sStack_33e < sStack_34e) * sStack_34e |
           (ushort)(sStack_33e >= sStack_34e) * sStack_33e;
  uVar28 = (ushort)(sStack_33c < sStack_34c) * sStack_34c |
           (ushort)(sStack_33c >= sStack_34c) * sStack_33c;
  uVar29 = (ushort)(sStack_33a < sStack_34a) * sStack_34a |
           (ushort)(sStack_33a >= sStack_34a) * sStack_33a;
  uVar10 = *(undefined8 *)zero[0];
  uVar11 = *(undefined8 *)(zero[0] + 8);
  local_368 = (short)uVar10;
  sStack_366 = (short)((ulong)uVar10 >> 0x10);
  sStack_364 = (short)((ulong)uVar10 >> 0x20);
  sStack_362 = (short)((ulong)uVar10 >> 0x30);
  sStack_360 = (short)uVar11;
  sStack_35e = (short)((ulong)uVar11 >> 0x10);
  sStack_35c = (short)((ulong)uVar11 >> 0x20);
  sStack_35a = (short)((ulong)uVar11 >> 0x30);
  *(ushort *)zero[0] =
       (local_368 < (short)uVar16) * uVar16 | (ushort)(local_368 >= (short)uVar16) * local_368;
  *(ushort *)(zero[0] + 2) =
       (sStack_366 < (short)uVar21) * uVar21 | (ushort)(sStack_366 >= (short)uVar21) * sStack_366;
  *(ushort *)(zero[0] + 4) =
       (sStack_364 < (short)uVar22) * uVar22 | (ushort)(sStack_364 >= (short)uVar22) * sStack_364;
  *(ushort *)(zero[0] + 6) =
       (sStack_362 < (short)uVar23) * uVar23 | (ushort)(sStack_362 >= (short)uVar23) * sStack_362;
  *(ushort *)(zero[0] + 8) =
       (sStack_360 < (short)uVar24) * uVar24 | (ushort)(sStack_360 >= (short)uVar24) * sStack_360;
  *(ushort *)(zero[0] + 10) =
       (sStack_35e < (short)uVar27) * uVar27 | (ushort)(sStack_35e >= (short)uVar27) * sStack_35e;
  *(ushort *)(zero[0] + 0xc) =
       (sStack_35c < (short)uVar28) * uVar28 | (ushort)(sStack_35c >= (short)uVar28) * sStack_35c;
  *(ushort *)(zero[0] + 0xe) =
       (sStack_35a < (short)uVar29) * uVar29 | (ushort)(sStack_35a >= (short)uVar29) * sStack_35a;
  return;
}

Assistant:

static inline void quantize_lp(const int16_t *iscan_ptr,
                               const int16_t *coeff_ptr, intptr_t n_coeffs,
                               int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                               const __m128i *round0, const __m128i *round1,
                               const __m128i *quant0, const __m128i *quant1,
                               const __m128i *dequant0, const __m128i *dequant1,
                               __m128i *eob) {
  const int16_t *read = coeff_ptr + n_coeffs;
  __m128i coeff0 = _mm_load_si128((const __m128i *)read);
  __m128i coeff1 = _mm_load_si128((const __m128i *)read + 1);

  // Poor man's sign extract
  const __m128i coeff0_sign = _mm_srai_epi16(coeff0, 15);
  const __m128i coeff1_sign = _mm_srai_epi16(coeff1, 15);
  __m128i qcoeff0 = _mm_xor_si128(coeff0, coeff0_sign);
  __m128i qcoeff1 = _mm_xor_si128(coeff1, coeff1_sign);
  qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
  qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);

  qcoeff0 = _mm_adds_epi16(qcoeff0, *round0);
  qcoeff1 = _mm_adds_epi16(qcoeff1, *round1);
  const __m128i qtmp0 = _mm_mulhi_epi16(qcoeff0, *quant0);
  const __m128i qtmp1 = _mm_mulhi_epi16(qcoeff1, *quant1);

  // Reinsert signs
  qcoeff0 = _mm_xor_si128(qtmp0, coeff0_sign);
  qcoeff1 = _mm_xor_si128(qtmp1, coeff1_sign);
  qcoeff0 = _mm_sub_epi16(qcoeff0, coeff0_sign);
  qcoeff1 = _mm_sub_epi16(qcoeff1, coeff1_sign);

  int16_t *addr = qcoeff_ptr + n_coeffs;
  _mm_store_si128((__m128i *)addr, qcoeff0);
  _mm_store_si128((__m128i *)addr + 1, qcoeff1);

  coeff0 = _mm_mullo_epi16(qcoeff0, *dequant0);
  coeff1 = _mm_mullo_epi16(qcoeff1, *dequant1);

  addr = dqcoeff_ptr + n_coeffs;
  _mm_store_si128((__m128i *)addr, coeff0);
  _mm_store_si128((__m128i *)addr + 1, coeff1);

  const __m128i zero = _mm_setzero_si128();
  // Scan for eob
  const __m128i zero_coeff0 = _mm_cmpeq_epi16(coeff0, zero);
  const __m128i zero_coeff1 = _mm_cmpeq_epi16(coeff1, zero);
  const __m128i nzero_coeff0 = _mm_cmpeq_epi16(zero_coeff0, zero);
  const __m128i nzero_coeff1 = _mm_cmpeq_epi16(zero_coeff1, zero);

  const __m128i iscan0 =
      _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs));
  const __m128i iscan1 =
      _mm_load_si128((const __m128i *)(iscan_ptr + n_coeffs) + 1);

  // Add one to convert from indices to counts
  const __m128i iscan0_nz = _mm_sub_epi16(iscan0, nzero_coeff0);
  const __m128i iscan1_nz = _mm_sub_epi16(iscan1, nzero_coeff1);
  const __m128i eob0 = _mm_and_si128(iscan0_nz, nzero_coeff0);
  const __m128i eob1 = _mm_and_si128(iscan1_nz, nzero_coeff1);
  const __m128i eob2 = _mm_max_epi16(eob0, eob1);
  *eob = _mm_max_epi16(*eob, eob2);
}